

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncRgbLedAnalyzer.cpp
# Opt level: O1

ReadResult * __thiscall
AsyncRgbLedAnalyzer::ReadBit(ReadResult *__return_storage_ptr__,AsyncRgbLedAnalyzer *this)

{
  BitState *value;
  bool bVar1;
  char cVar2;
  int iVar3;
  U64 UVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  BitState BVar8;
  char *pcVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double t;
  undefined1 auVar13 [16];
  BitTiming local_60;
  
  *(undefined8 *)&__return_storage_ptr__->mBitValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->mBeginSample + 4) = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->mEndSample + 4) = 0;
  __return_storage_ptr__->mValid = false;
  __return_storage_ptr__->mIsReset = false;
  iVar3 = AnalyzerChannelData::GetBitState();
  if (iVar3 == 0) {
    AnalyzerChannelData::AdvanceToNextEdge();
  }
  value = &__return_storage_ptr__->mBitValue;
  UVar4 = AnalyzerChannelData::GetSampleNumber();
  __return_storage_ptr__->mBeginSample = UVar4;
  AnalyzerChannelData::AdvanceToNextEdge();
  lVar5 = AnalyzerChannelData::GetSampleNumber();
  lVar6 = lVar5 - UVar4;
  auVar10._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar10._0_8_ = lVar6;
  auVar10._12_4_ = 0x45300000;
  dVar12 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / this->mSampleRateHz;
  if (this->mFirstBitAfterReset == false) {
    BVar8 = BIT_LOW;
    AsyncRgbLedAnalyzerSettings::DataTiming
              (&local_60,
               (this->mSettings)._M_t.
               super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               ._M_t.
               super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl,BIT_LOW,
               this->mDidDetectHighSpeed);
    bVar1 = TimingTolerance::WithinTolerance(&local_60.mPositiveTiming,dVar12);
    if (!bVar1) {
      BVar8 = BIT_HIGH;
      AsyncRgbLedAnalyzerSettings::DataTiming
                (&local_60,
                 (this->mSettings)._M_t.
                 super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                 .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl,BIT_HIGH,
                 this->mDidDetectHighSpeed);
      bVar1 = TimingTolerance::WithinTolerance(&local_60.mPositiveTiming,dVar12);
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"positive pulse timing doesn\'t match detected speed mode",
                   0x37);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
        std::ostream::put(' ');
        std::ostream::flush();
        AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mChannelData);
        return __return_storage_ptr__;
      }
    }
    *value = BVar8;
  }
  cVar2 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mChannelData);
  if (cVar2 == '\0') {
    AsyncRgbLedAnalyzerSettings::ResetTiming
              (&local_60.mPositiveTiming,
               (this->mSettings)._M_t.
               super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               ._M_t.
               super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
               .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl);
    cVar2 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mChannelData);
    if (cVar2 == '\0') {
      if (this->mFirstBitAfterReset == true) {
        pcVar9 = "No complete bit between resets, can\'t decode";
        lVar6 = 0x2c;
        goto LAB_00107358;
      }
      AnalyzerChannelData::Advance((uint)this->mChannelData);
      __return_storage_ptr__->mIsReset = true;
    }
    else {
      AnalyzerChannelData::AdvanceToNextEdge();
      lVar6 = AnalyzerChannelData::GetSampleNumber();
      __return_storage_ptr__->mEndSample = lVar6 - 1;
    }
    if (__return_storage_ptr__->mIsReset == true) {
      __return_storage_ptr__->mValid = true;
      AsyncRgbLedAnalyzerSettings::DataTiming
                (&local_60,
                 (this->mSettings)._M_t.
                 super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                 .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl,
                 __return_storage_ptr__->mBitValue,this->mDidDetectHighSpeed);
      auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar11._0_8_ = lVar5;
      auVar11._12_4_ = 0x45300000;
      dVar12 = local_60.mNegativeTiming.mNominalSec * this->mSampleRateHz +
               (auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
      uVar7 = (ulong)dVar12;
      __return_storage_ptr__->mEndSample =
           (long)(dVar12 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
    }
    else {
      lVar5 = __return_storage_ptr__->mEndSample - lVar5;
      auVar13._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar13._0_8_ = lVar5;
      auVar13._12_4_ = 0x45300000;
      t = ((auVar13._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / this->mSampleRateHz;
      if (this->mFirstBitAfterReset == true) {
        bVar1 = DetectSpeedMode(this,dVar12,t,value);
        __return_storage_ptr__->mValid = bVar1;
      }
      else {
        AsyncRgbLedAnalyzerSettings::DataTiming
                  (&local_60,
                   (this->mSettings)._M_t.
                   super___uniq_ptr_impl<AsyncRgbLedAnalyzerSettings,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_AsyncRgbLedAnalyzerSettings_*,_std::default_delete<AsyncRgbLedAnalyzerSettings>_>
                   .super__Head_base<0UL,_AsyncRgbLedAnalyzerSettings_*,_false>._M_head_impl,*value,
                   this->mDidDetectHighSpeed);
        bVar1 = TimingTolerance::WithinTolerance(&local_60.mNegativeTiming,t);
        if (!bVar1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"negative pulse timing doesn\'t match positive pulse",
                     0x32);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
          std::ostream::put(' ');
          std::ostream::flush();
        }
        __return_storage_ptr__->mValid = bVar1;
      }
    }
  }
  else {
    AnalyzerChannelData::AdvanceToNextEdge();
    pcVar9 = "too show low pulse, invalid bit";
    lVar6 = 0x1f;
LAB_00107358:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar9,lVar6);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
  }
  return __return_storage_ptr__;
}

Assistant:

auto AsyncRgbLedAnalyzer::ReadBit() -> ReadResult
{
    ReadResult result;
    result.mValid = false;

    if( mChannelData->GetBitState() == BIT_LOW )
    {
        mChannelData->AdvanceToNextEdge();
    }

    result.mBeginSample = mChannelData->GetSampleNumber();
    mChannelData->AdvanceToNextEdge();
    const U64 fallingEdgeSample = mChannelData->GetSampleNumber();
    const double highTimeSec = ( fallingEdgeSample - result.mBeginSample ) / mSampleRateHz;

    if( mFirstBitAfterReset )
    {
        // we can't classify yet, need to wait until we have the low pulse timing
    }
    else
    {
        // clasify based on existing value
        // ensure consistency with previously detected speed setting
        if( mSettings->DataTiming( BIT_LOW, mDidDetectHighSpeed ).mPositiveTiming.WithinTolerance( highTimeSec ) )
        {
            result.mBitValue = BIT_LOW;
        }
        else if( mSettings->DataTiming( BIT_HIGH, mDidDetectHighSpeed ).mPositiveTiming.WithinTolerance( highTimeSec ) )
        {
            result.mBitValue = BIT_HIGH;
        }
        else
        {
            std::cerr << "positive pulse timing doesn't match detected speed mode" << std::endl;
            mChannelData->AdvanceToAbsPosition( fallingEdgeSample );
            return result; // invalid result, reset required
        }
    }

    // check for a too-short low timing
    if( mChannelData->WouldAdvancingCauseTransition( mMinimumLowDurationSec * mSampleRateHz ) )
    {
        mChannelData->AdvanceToNextEdge();
        std::cerr << "too show low pulse, invalid bit" << std::endl;
        return result; // invalid result, reset required
    }

    // check for a low period exceeding the minimum reset time
    // if we exceed that, this is a reset
    const int minResetSamples = static_cast<int>( mSettings->ResetTiming().mMinimumSec * mSampleRateHz );

    if( !mChannelData->WouldAdvancingCauseTransition( minResetSamples ) )
    {
        // if we see a single bit in between resets, we can't decode the speed,
        // but this is meaningless anyway, so return an error
        if( mFirstBitAfterReset )
        {
            std::cerr << "No complete bit between resets, can't decode" << std::endl;
            return result; // return invalid
        }

        mChannelData->Advance( minResetSamples );
        result.mIsReset = true;
    }
    else
    {
        // we saw a transition, let's see the timing
        mChannelData->AdvanceToNextEdge();

        // the -1 is so the end of this frame, and start of the next, don't
        // overlap.
        result.mEndSample = mChannelData->GetSampleNumber() - 1;
    }

    if( result.mIsReset )
    {
        // if this bit is also a reset, we can't check the low time since it
        // will exceed the maximums, but we still want to accept that case
        // as valid
        result.mValid = true;

        // use the nominal negative pulse timing for the frame ending.
        double nominalNegativeSec = mSettings->DataTiming( result.mBitValue, mDidDetectHighSpeed ).mNegativeTiming.mNominalSec;
        result.mEndSample = fallingEdgeSample + ( nominalNegativeSec * mSampleRateHz );
    }
    else if( mFirstBitAfterReset )
    {
        const double lowTimeSec = ( result.mEndSample - fallingEdgeSample ) / mSampleRateHz;
        // two-way classification. This is necessary because the the 0-data
        // positive pulse of low-speed mode can match the 1-data positive pulse
        // in high speed mode, for some controllers. Hence we need to correlate
        // the high and low times to detect the speed mode

        // this also sets mBitValue correct as a side-effect of the detection
        result.mValid = DetectSpeedMode( highTimeSec, lowTimeSec, result.mBitValue );
    }
    else
    {
        // already detected the speed mode, ensure consistency
        const double lowTimeSec = ( result.mEndSample - fallingEdgeSample ) / mSampleRateHz;

        if( mSettings->DataTiming( result.mBitValue, mDidDetectHighSpeed ).mNegativeTiming.WithinTolerance( lowTimeSec ) )
        {
            // we are good
            result.mValid = true;
        }
        else
        {
            // we could do further classification here on the error, eg speed mismatch,
            // or bit value mismatch
            std::cerr << "negative pulse timing doesn't match positive pulse" << std::endl;
            result.mValid = false;
        }
    }

    return result;
}